

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlSchemaParserCtxtPtr xmlSchemaParserCtxtCreate(void)

{
  xmlSchemaParserCtxtPtr __s;
  xmlSchemaItemListPtr pxVar1;
  
  __s = (xmlSchemaParserCtxtPtr)(*xmlMalloc)(0x100);
  if (__s == (xmlSchemaParserCtxtPtr)0x0) {
    __s = (xmlSchemaParserCtxtPtr)0x0;
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x10,
                        (xmlError *)0x0);
  }
  else {
    memset(__s,0,0x100);
    __s->type = 1;
    pxVar1 = xmlSchemaItemListCreate();
    __s->attrProhibs = pxVar1;
    if (pxVar1 == (xmlSchemaItemListPtr)0x0) {
      (*xmlFree)(__s);
      __s = (xmlSchemaParserCtxtPtr)0x0;
    }
  }
  return __s;
}

Assistant:

static xmlSchemaParserCtxtPtr
xmlSchemaParserCtxtCreate(void)
{
    xmlSchemaParserCtxtPtr ret;

    ret = (xmlSchemaParserCtxtPtr) xmlMalloc(sizeof(xmlSchemaParserCtxt));
    if (ret == NULL) {
        xmlSchemaPErrMemory(NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaParserCtxt));
    ret->type = XML_SCHEMA_CTXT_PARSER;
    ret->attrProhibs = xmlSchemaItemListCreate();
    if (ret->attrProhibs == NULL) {
	xmlFree(ret);
	return(NULL);
    }
    return(ret);
}